

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall
httplib::detail::SocketStream::get_remote_ip_and_port(SocketStream *this,string *ip,int *port)

{
  char *pcVar1;
  socklen_t __salen;
  int iVar2;
  char local_4b1 [8];
  array<char,_1025UL> ipstr;
  sockaddr_storage addr;
  
  addr.__ss_align._4_4_ = 0x80;
  iVar2 = getpeername(this->sock_,(sockaddr *)(ipstr._M_elems + 0x3f9),
                      (socklen_t *)((long)&addr.__ss_align + 4));
  __salen = addr.__ss_align._4_4_;
  if ((iVar2 == 0) && ((ipstr._M_elems._1017_2_ | 8) == 10)) {
    *port = (uint)(ushort)(ipstr._M_elems._1019_2_ << 8 | (ushort)ipstr._M_elems._1019_2_ >> 8);
    memset(local_4b1,0,0x401);
    iVar2 = getnameinfo((sockaddr *)(ipstr._M_elems + 0x3f9),__salen,local_4b1,0x401,(char *)0x0,0,1
                       );
    if (iVar2 == 0) {
      pcVar1 = (char *)ip->_M_string_length;
      strlen(local_4b1);
      std::__cxx11::string::_M_replace((ulong)ip,0,pcVar1,(ulong)local_4b1);
    }
  }
  return;
}

Assistant:

inline void SocketStream::get_remote_ip_and_port(std::string& ip,
            int& port) const {
            return detail::get_remote_ip_and_port(sock_, ip, port);
        }